

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.h
# Opt level: O2

string * cmStrCat<std::__cxx11::string,char[2],char[32],std::basic_string_view<char,std::char_traits<char>>>
                   (string *__return_storage_ptr__,cmAlphaNum *a,cmAlphaNum *b,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
                   char (*args_1) [2],char (*args_2) [32],
                   basic_string_view<char,_std::char_traits<char>_> *args_3)

{
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  basic_string_view<char,_std::char_traits<char>_> local_88;
  size_t local_78;
  char *pcStack_70;
  size_type local_68;
  pointer local_60;
  size_t local_58;
  char (*local_50) [2];
  size_t local_48;
  char (*local_40) [32];
  size_t local_38;
  char *pcStack_30;
  
  local_88._M_len = (a->View_)._M_len;
  local_88._M_str = (a->View_)._M_str;
  local_78 = (b->View_)._M_len;
  pcStack_70 = (b->View_)._M_str;
  local_60 = (args->_M_dataplus)._M_p;
  local_68 = args->_M_string_length;
  local_58 = strlen(*args_1);
  local_50 = args_1;
  local_48 = strlen(*args_2);
  local_38 = args_3->_M_len;
  pcStack_30 = args_3->_M_str;
  views._M_len = 6;
  views._M_array = &local_88;
  local_40 = args_2;
  cmCatViews_abi_cxx11_(__return_storage_ptr__,views);
  return __return_storage_ptr__;
}

Assistant:

inline std::string cmStrCat(cmAlphaNum const& a, cmAlphaNum const& b,
                            AV const&... args)
{
  return cmCatViews(
    { a.View(), b.View(), static_cast<cmAlphaNum const&>(args).View()... });
}